

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catbtor.c
# Opt level: O1

int32_t main(int32_t argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  char *pcVar7;
  char *__s1;
  bool bVar8;
  undefined1 local_40 [16];
  
  bVar8 = true;
  if (1 < argc) {
    iVar3 = 0;
    uVar6 = 1;
    pcVar7 = input_name;
    do {
      __s1 = argv[uVar6];
      iVar2 = strcmp(__s1,"-h");
      if (iVar2 == 0) {
        main_cold_9();
LAB_0010169c:
        main_cold_2();
LAB_001016a4:
        main_cold_1();
        goto LAB_001016a9;
      }
      iVar2 = strcmp(__s1,"-v");
      if (iVar2 != 0) {
        if (*__s1 == '-') goto LAB_0010169c;
        pcVar1 = __s1;
        if (pcVar7 == (char *)0x0) goto LAB_00101447;
        goto LAB_001016a4;
      }
      iVar3 = iVar3 + 1;
      __s1 = pcVar7;
      pcVar1 = input_name;
LAB_00101447:
      input_name = pcVar1;
      uVar6 = uVar6 + 1;
      pcVar7 = __s1;
    } while ((uint)argc != uVar6);
    bVar8 = iVar3 == 0;
  }
  if (input_name == (char *)0x0) {
    input_file = _stdin;
    input_name = "<stdin>";
  }
  else {
    input_file = (FILE *)fopen(input_name,"r");
    if ((FILE *)input_file == (FILE *)0x0) goto LAB_001016b6;
    close_input = '\x01';
  }
  if (!bVar8) {
    main_cold_4();
  }
  uVar4 = btor2parser_new();
  iVar3 = btor2parser_read_lines(uVar4,input_file);
  if (iVar3 != 0) {
    if (close_input == '\x01') {
      fclose((FILE *)input_file);
    }
    if (!bVar8) {
      main_cold_5();
    }
    local_40 = btor2parser_iter_init(uVar4);
    puVar5 = (undefined8 *)btor2parser_iter_next();
    if (puVar5 != (undefined8 *)0x0) {
      do {
        printf("%ld %s",*puVar5,puVar5[2]);
        if (*(int *)(puVar5 + 3) == 0x2d) {
          printf(" %s",puVar5[6]);
          if (*(int *)(puVar5 + 5) == 0) {
            printf(" %ld %ld",puVar5[7],puVar5[8]);
          }
          else {
            if (*(int *)(puVar5 + 5) != 1) goto LAB_001016a9;
            printf(" %u",(ulong)*(uint *)(puVar5 + 7));
          }
        }
        else if (puVar5[4] != 0) {
          printf(" %ld");
        }
        if (*(int *)(puVar5 + 0xd) != 0) {
          uVar6 = 0;
          do {
            printf(" %ld",*(undefined8 *)(puVar5[0xe] + uVar6 * 8));
            uVar6 = uVar6 + 1;
          } while (uVar6 < *(uint *)(puVar5 + 0xd));
        }
        if (*(int *)(puVar5 + 3) == 0x29) {
          printf(" %ld %ld",*(undefined8 *)(puVar5[0xe] + 8),*(undefined8 *)(puVar5[0xe] + 0x10));
        }
        if ((*(int *)(puVar5 + 3) == 0x38) || (*(int *)(puVar5 + 3) == 0x26)) {
          printf(" %ld",*(undefined8 *)(puVar5[0xe] + 8));
        }
        if (puVar5[0xb] != 0) {
          printf(" %s");
        }
        if (puVar5[0xc] != 0) {
          printf(" %s");
        }
        fputc(10,_stdout);
        puVar5 = (undefined8 *)btor2parser_iter_next(local_40);
      } while (puVar5 != (undefined8 *)0x0);
    }
    btor2parser_delete(uVar4);
    if (!bVar8) {
      main_cold_7();
    }
    return 0;
  }
LAB_001016ae:
  main_cold_8();
LAB_001016b6:
  main_cold_3();
  halt_baddata();
LAB_001016a9:
  main_cold_6();
  goto LAB_001016ae;
}

Assistant:

int32_t
main (int32_t argc, char** argv)
{
  Btor2Parser* reader;
  Btor2LineIterator it;
  Btor2Line* l;
  uint32_t j;
  int32_t i, verbosity = 0;
  const char* err;
  for (i = 1; i < argc; i++)
  {
    if (!strcmp (argv[i], "-h"))
    {
      fprintf (stderr, "usage: catbtor [-h|-v] [ <btorfile> ]\n");
      exit (1);
    }
    else if (!strcmp (argv[i], "-v"))
      verbosity++;
    else if (argv[i][0] == '-')
    {
      fprintf (
          stderr, "*** catbtor: invalid option '%s' (try '-h')\n", argv[i]);
      exit (1);
    }
    else if (input_name)
    {
      fprintf (stderr, "*** catbtor: too many inputs (try '-h')\n");
      exit (1);
    }
    else
      input_name = argv[i];
  }
  if (!input_name)
  {
    input_file = stdin;
    assert (!close_input);
    input_name = "<stdin>";
  }
  else
  {
    input_file = fopen (input_name, "r");
    if (!input_file)
    {
      fprintf (
          stderr, "*** catbtor: can not open '%s' for reading\n", input_name);
      exit (1);
    }
    close_input = 1;
  }
  if (verbosity)
  {
    fprintf (stderr,
             "; [catbor] simple CAT for BTOR files\n"
             "; [catbor] reading '%s'\n",
             input_name);
    fflush (stderr);
  }
  reader = btor2parser_new ();
  if (!btor2parser_read_lines (reader, input_file))
  {
    err = btor2parser_error (reader);
    assert (err);
    fprintf (stderr, "*** catbtor: parse error in '%s' %s\n", input_name, err);
    btor2parser_delete (reader);
    if (close_input) fclose (input_file);
    exit (1);
  }
  if (close_input) fclose (input_file);
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] finished parsing '%s'\n", input_name);
    fflush (stderr);
  }
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] starting to dump BTOR model to '<stdout>'\n");
    fflush (stderr);
  }
  it = btor2parser_iter_init (reader);
  while ((l = btor2parser_iter_next (&it)))
  {
    printf ("%" PRId64 " %s", l->id, l->name);
    if (l->tag == BTOR2_TAG_sort)
    {
      printf (" %s", l->sort.name);
      switch (l->sort.tag)
      {
        case BTOR2_TAG_SORT_bitvec: printf (" %u", l->sort.bitvec.width); break;
        case BTOR2_TAG_SORT_array:
          printf (" %" PRId64 " %" PRId64, l->sort.array.index, l->sort.array.element);
          break;
        default:
          assert (0);
          fprintf (stderr, "*** catbtor: invalid sort encountered\n");
          exit (1);
      }
    }
    else if (l->sort.id)
      printf (" %" PRId64, l->sort.id);
    for (j = 0; j < l->nargs; j++) printf (" %" PRId64, l->args[j]);
    if (l->tag == BTOR2_TAG_slice) printf (" %" PRId64 " %" PRId64, l->args[1], l->args[2]);
    if (l->tag == BTOR2_TAG_sext || l->tag == BTOR2_TAG_uext)
      printf (" %" PRId64, l->args[1]);
    if (l->constant) printf (" %s", l->constant);
    if (l->symbol) printf (" %s", l->symbol);
    fputc ('\n', stdout);
  }
  btor2parser_delete (reader);
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] finished dumping BTOR model to '<stdout>'\n");
    fflush (stderr);
  }
  return 0;
}